

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O2

EC_KEY * EC_KEY_parse_private_key(CBS *cbs,EC_GROUP *group)

{
  UniquePtr<EC_KEY> UVar1;
  int iVar2;
  EC_GROUP *b;
  EC_POINT *pEVar3;
  int iVar4;
  pointer __p;
  _Head_base<0UL,_ec_key_st_*,_false> _Var5;
  uint8_t padding;
  UniquePtr<EC_KEY> ret;
  CBS ec_private_key;
  UniquePtr<BIGNUM> priv_key;
  CBS child;
  CBS public_key;
  uint64_t version;
  CBS private_key;
  
  iVar2 = CBS_get_asn1(cbs,&ec_private_key,0x20000010);
  if ((((iVar2 == 0) || (iVar2 = CBS_get_asn1_uint64(&ec_private_key,&version), iVar2 == 0)) ||
      (version != 1)) || (iVar2 = CBS_get_asn1(&ec_private_key,&private_key,4), iVar2 == 0)) {
    iVar4 = 0x35;
    iVar2 = 0x80;
LAB_001a1866:
    ERR_put_error(0xf,0,iVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                  ,iVar4);
    return (EC_KEY *)0x0;
  }
  iVar2 = CBS_peek_asn1_tag(&ec_private_key,0xa0000000);
  if (iVar2 != 0) {
    iVar2 = CBS_get_asn1(&ec_private_key,&child,0xa0000000);
    if (iVar2 == 0) {
      iVar2 = 0x41;
    }
    else {
      b = EC_KEY_parse_parameters(&child);
      if (b == (EC_GROUP *)0x0) {
        return (EC_KEY *)0x0;
      }
      if ((group != (EC_GROUP *)0x0) &&
         (iVar2 = EC_GROUP_cmp((EC_GROUP *)group,(EC_GROUP *)b,(BN_CTX *)0x0), b = group, iVar2 != 0
         )) {
        iVar2 = 0x4c;
        iVar4 = 0x82;
        goto LAB_001a1a07;
      }
      group = b;
      if (child.len == 0) goto LAB_001a1881;
      iVar2 = 0x50;
    }
    iVar4 = 0x80;
LAB_001a1a07:
    ERR_put_error(0xf,0,iVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                  ,iVar2);
    return (EC_KEY *)0x0;
  }
  if (group == (EC_GROUP *)0x0) {
    iVar2 = 0x72;
    iVar4 = 0x56;
    goto LAB_001a1866;
  }
LAB_001a1881:
  ret._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ec_key_st,_bssl::internal::Deleter,_true,_true>)EC_KEY_new();
  if (((tuple<ec_key_st_*,_bssl::internal::Deleter>)
       ret._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl ==
       (_Head_base<0UL,_ec_key_st_*,_false>)0x0) ||
     (iVar2 = EC_KEY_set_group((EC_KEY *)
                               ret._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>.
                               _M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl,
                               (EC_GROUP *)group), iVar2 == 0)) {
    _Var5._M_head_impl = (ec_key_st *)0x0;
    goto LAB_001a1a9e;
  }
  _Var5._M_head_impl = (ec_key_st *)0x0;
  priv_key._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
       BN_bin2bn(private_key.data,(int)private_key.len,(BIGNUM *)0x0);
  pEVar3 = EC_POINT_new((EC_GROUP *)group);
  UVar1 = ret;
  *(EC_POINT **)
   ((long)ret._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl + 8) = pEVar3;
  if (((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
       priv_key._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) && (pEVar3 != (EC_POINT *)0x0)) {
    iVar2 = EC_KEY_set_private_key
                      ((EC_KEY *)
                       ret._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl,
                       (BIGNUM *)
                       priv_key._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
    if (iVar2 != 0) {
      iVar2 = CBS_peek_asn1_tag(&ec_private_key,0xa0000001);
      if (iVar2 != 0) {
        iVar2 = CBS_get_asn1(&ec_private_key,&child,0xa0000001);
        if (((((iVar2 != 0) && (iVar2 = CBS_get_asn1(&child,&public_key,3), iVar2 != 0)) &&
             (iVar2 = CBS_get_u8(&public_key,&padding), iVar2 != 0)) &&
            ((padding == '\0' && (public_key.len != 0)))) &&
           ((iVar2 = EC_POINT_oct2point((EC_GROUP *)group,
                                        *(EC_POINT **)
                                         ((long)UVar1._M_t.
                                                super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_ec_key_st_*,_false>.
                                                _M_head_impl + 8),public_key.data,public_key.len,
                                        (BN_CTX *)0x0), iVar2 != 0 && (child.len == 0)))) {
          *(uint *)((long)ret._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl + 0x1c) =
               *public_key.data & 0xfffffffe;
          goto LAB_001a1a54;
        }
        iVar2 = 0x79;
LAB_001a1a76:
        _Var5._M_head_impl = (EC_KEY *)0x0;
        ERR_put_error(0xf,0,0x80,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                      ,iVar2);
        goto LAB_001a1a94;
      }
      iVar2 = ec_point_mul_scalar_base
                        (group,(EC_JACOBIAN *)
                               (*(long *)((long)UVar1._M_t.
                                                super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_ec_key_st_*,_false>.
                                                _M_head_impl + 8) + 8),
                         (EC_SCALAR *)
                         (*(long *)((long)UVar1._M_t.
                                          super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl +
                                   0x10) + 0x18));
      if (iVar2 != 0) {
        *(uint *)((long)ret._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl + 0x18) =
             *(uint *)((long)ret._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t
                             .super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl + 0x18) | 2;
LAB_001a1a54:
        _Var5._M_head_impl =
             (ec_key_st *)
             ret._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl;
        if (ec_private_key.len != 0) {
          iVar2 = 0x8d;
          goto LAB_001a1a76;
        }
        iVar2 = EC_KEY_check_key((EC_KEY *)
                                 ret._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
        if (iVar2 != 0) {
          ret._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<ec_key_st,_bssl::internal::Deleter,_true,_true>)
               (__uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>)0x0;
          goto LAB_001a1a94;
        }
      }
    }
    _Var5._M_head_impl = (EC_KEY *)0x0;
  }
LAB_001a1a94:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&priv_key);
LAB_001a1a9e:
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr(&ret);
  return (ec_key_st *)(_Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>)_Var5._M_head_impl;
}

Assistant:

EC_KEY *EC_KEY_parse_private_key(CBS *cbs, const EC_GROUP *group) {
  CBS ec_private_key, private_key;
  uint64_t version;
  if (!CBS_get_asn1(cbs, &ec_private_key, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1_uint64(&ec_private_key, &version) ||  //
      version != 1 ||
      !CBS_get_asn1(&ec_private_key, &private_key, CBS_ASN1_OCTETSTRING)) {
    OPENSSL_PUT_ERROR(EC, EC_R_DECODE_ERROR);
    return nullptr;
  }

  // Parse the optional parameters field.
  if (CBS_peek_asn1_tag(&ec_private_key, kParametersTag)) {
    // Per SEC 1, as an alternative to omitting it, one is allowed to specify
    // this field and put in a NULL to mean inheriting this value. This was
    // omitted in a previous version of this logic without problems, so leave it
    // unimplemented.
    CBS child;
    if (!CBS_get_asn1(&ec_private_key, &child, kParametersTag)) {
      OPENSSL_PUT_ERROR(EC, EC_R_DECODE_ERROR);
      return nullptr;
    }
    const EC_GROUP *inner_group = EC_KEY_parse_parameters(&child);
    if (inner_group == nullptr) {
      return nullptr;
    }
    if (group == nullptr) {
      group = inner_group;
    } else if (EC_GROUP_cmp(group, inner_group, nullptr) != 0) {
      // If a group was supplied externally, it must match.
      OPENSSL_PUT_ERROR(EC, EC_R_GROUP_MISMATCH);
      return nullptr;
    }
    if (CBS_len(&child) != 0) {
      OPENSSL_PUT_ERROR(EC, EC_R_DECODE_ERROR);
      return nullptr;
    }
  }

  if (group == nullptr) {
    OPENSSL_PUT_ERROR(EC, EC_R_MISSING_PARAMETERS);
    return nullptr;
  }

  bssl::UniquePtr<EC_KEY> ret(EC_KEY_new());
  if (ret == nullptr || !EC_KEY_set_group(ret.get(), group)) {
    return nullptr;
  }

  // Although RFC 5915 specifies the length of the key, OpenSSL historically
  // got this wrong, so accept any length. See upstream's
  // 30cd4ff294252c4b6a4b69cbef6a5b4117705d22.
  bssl::UniquePtr<BIGNUM> priv_key(
      BN_bin2bn(CBS_data(&private_key), CBS_len(&private_key), nullptr));
  ret->pub_key = EC_POINT_new(group);
  if (priv_key == nullptr || ret->pub_key == nullptr ||
      !EC_KEY_set_private_key(ret.get(), priv_key.get())) {
    return nullptr;
  }

  if (CBS_peek_asn1_tag(&ec_private_key, kPublicKeyTag)) {
    CBS child, public_key;
    uint8_t padding;
    if (!CBS_get_asn1(&ec_private_key, &child, kPublicKeyTag) ||
        !CBS_get_asn1(&child, &public_key, CBS_ASN1_BITSTRING) ||
        // As in a SubjectPublicKeyInfo, the byte-encoded public key is then
        // encoded as a BIT STRING with bits ordered as in the DER encoding.
        !CBS_get_u8(&public_key, &padding) ||  //
        padding != 0 ||
        // Explicitly check |public_key| is non-empty to save the conversion
        // form later.
        CBS_len(&public_key) == 0 ||
        !EC_POINT_oct2point(group, ret->pub_key, CBS_data(&public_key),
                            CBS_len(&public_key), nullptr) ||
        CBS_len(&child) != 0) {
      OPENSSL_PUT_ERROR(EC, EC_R_DECODE_ERROR);
      return nullptr;
    }

    // Save the point conversion form.
    // TODO(davidben): Consider removing this.
    ret->conv_form =
        (point_conversion_form_t)(CBS_data(&public_key)[0] & ~0x01);
  } else {
    // Compute the public key instead.
    if (!ec_point_mul_scalar_base(group, &ret->pub_key->raw,
                                  &ret->priv_key->scalar)) {
      return nullptr;
    }
    // Remember the original private-key-only encoding.
    // TODO(davidben): Consider removing this.
    ret->enc_flag |= EC_PKEY_NO_PUBKEY;
  }

  if (CBS_len(&ec_private_key) != 0) {
    OPENSSL_PUT_ERROR(EC, EC_R_DECODE_ERROR);
    return nullptr;
  }

  // Ensure the resulting key is valid.
  if (!EC_KEY_check_key(ret.get())) {
    return nullptr;
  }

  return ret.release();
}